

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O3

string * GetOpName_abi_cxx11_(string *__return_storage_ptr__,opcodetype opcode)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(opcode) {
  case OP_0:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "0";
      pcVar2 = "";
LAB_0041cdc5:
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,pcVar3,pcVar2);
      return __return_storage_ptr__;
    }
    break;
  default:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_UNKNOWN";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_PUSHDATA1:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_PUSHDATA1";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_PUSHDATA2:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_PUSHDATA2";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_PUSHDATA4:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_PUSHDATA4";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_1NEGATE:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "-1";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_RESERVED:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_RESERVED";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_1:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "1";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_2:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "2";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_3:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "3";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_4:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "4";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_5:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "5";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_6:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "6";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_7:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "7";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_8:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "8";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_9:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "9";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_10:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "10";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_11:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "11";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_12:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "12";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_13:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "13";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_14:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "14";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_15:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "15";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_16:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "16";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_NOP:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_NOP";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_VER:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_VER";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_IF:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_IF";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_NOTIF:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_NOTIF";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_VERIF:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_VERIF";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_VERNOTIF:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_VERNOTIF";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_ELSE:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_ELSE";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_ENDIF:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_ENDIF";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_VERIFY:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_VERIFY";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_RETURN:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_RETURN";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_TOALTSTACK:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_TOALTSTACK";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_FROMALTSTACK:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_FROMALTSTACK";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_2DROP:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_2DROP";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_2DUP:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_2DUP";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_3DUP:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_3DUP";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_2OVER:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_2OVER";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_2ROT:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_2ROT";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_2SWAP:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_2SWAP";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_IFDUP:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_IFDUP";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_DEPTH:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_DEPTH";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_DROP:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_DROP";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_DUP:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_DUP";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_NIP:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_NIP";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_OVER:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_OVER";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_PICK:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_PICK";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_ROLL:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_ROLL";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_ROT:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_ROT";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_SWAP:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_SWAP";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_TUCK:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_TUCK";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_CAT:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_CAT";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_SUBSTR:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_SUBSTR";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_LEFT:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_LEFT";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_RIGHT:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_RIGHT";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_SIZE:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_SIZE";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_INVERT:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_INVERT";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_AND:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_AND";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_OR:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_OR";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_XOR:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_XOR";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_EQUAL:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_EQUAL";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_EQUALVERIFY:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_EQUALVERIFY";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_RESERVED1:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_RESERVED1";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_RESERVED2:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_RESERVED2";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_1ADD:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_1ADD";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_1SUB:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_1SUB";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_2MUL:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_2MUL";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_2DIV:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_2DIV";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_NEGATE:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_NEGATE";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_ABS:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_ABS";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_NOT:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_NOT";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_0NOTEQUAL:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_0NOTEQUAL";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_ADD:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_ADD";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_SUB:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_SUB";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_MUL:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_MUL";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_DIV:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_DIV";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_MOD:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_MOD";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_LSHIFT:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_LSHIFT";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_RSHIFT:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_RSHIFT";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_BOOLAND:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_BOOLAND";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_BOOLOR:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_BOOLOR";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_NUMEQUAL:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_NUMEQUAL";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_NUMEQUALVERIFY:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_NUMEQUALVERIFY";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_NUMNOTEQUAL:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_NUMNOTEQUAL";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_LESSTHAN:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_LESSTHAN";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_GREATERTHAN:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_GREATERTHAN";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_LESSTHANOREQUAL:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_LESSTHANOREQUAL";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_GREATERTHANOREQUAL:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_GREATERTHANOREQUAL";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_MIN:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_MIN";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_MAX:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_MAX";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_WITHIN:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_WITHIN";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_RIPEMD160:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_RIPEMD160";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_SHA1:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_SHA1";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_SHA256:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_SHA256";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_HASH160:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_HASH160";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_HASH256:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_HASH256";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_CODESEPARATOR:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_CODESEPARATOR";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_CHECKSIG:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_CHECKSIG";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_CHECKSIGVERIFY:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_CHECKSIGVERIFY";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_CHECKMULTISIG:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_CHECKMULTISIG";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_CHECKMULTISIGVERIFY:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_CHECKMULTISIGVERIFY";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_NOP1:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_NOP1";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_CHECKLOCKTIMEVERIFY:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_CHECKLOCKTIMEVERIFY";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_CHECKSEQUENCEVERIFY:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_CHECKSEQUENCEVERIFY";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_NOP4:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_NOP4";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_NOP5:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_NOP5";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_NOP6:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_NOP6";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_NOP7:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_NOP7";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_NOP8:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_NOP8";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_NOP9:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_NOP9";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_NOP10:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_NOP10";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_CHECKSIGADD:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_CHECKSIGADD";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
    break;
  case OP_INVALIDOPCODE:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_INVALIDOPCODE";
      pcVar2 = "";
      goto LAB_0041cdc5;
    }
  }
  __stack_chk_fail();
}

Assistant:

std::string GetOpName(opcodetype opcode)
{
    switch (opcode)
    {
    // push value
    case OP_0                      : return "0";
    case OP_PUSHDATA1              : return "OP_PUSHDATA1";
    case OP_PUSHDATA2              : return "OP_PUSHDATA2";
    case OP_PUSHDATA4              : return "OP_PUSHDATA4";
    case OP_1NEGATE                : return "-1";
    case OP_RESERVED               : return "OP_RESERVED";
    case OP_1                      : return "1";
    case OP_2                      : return "2";
    case OP_3                      : return "3";
    case OP_4                      : return "4";
    case OP_5                      : return "5";
    case OP_6                      : return "6";
    case OP_7                      : return "7";
    case OP_8                      : return "8";
    case OP_9                      : return "9";
    case OP_10                     : return "10";
    case OP_11                     : return "11";
    case OP_12                     : return "12";
    case OP_13                     : return "13";
    case OP_14                     : return "14";
    case OP_15                     : return "15";
    case OP_16                     : return "16";

    // control
    case OP_NOP                    : return "OP_NOP";
    case OP_VER                    : return "OP_VER";
    case OP_IF                     : return "OP_IF";
    case OP_NOTIF                  : return "OP_NOTIF";
    case OP_VERIF                  : return "OP_VERIF";
    case OP_VERNOTIF               : return "OP_VERNOTIF";
    case OP_ELSE                   : return "OP_ELSE";
    case OP_ENDIF                  : return "OP_ENDIF";
    case OP_VERIFY                 : return "OP_VERIFY";
    case OP_RETURN                 : return "OP_RETURN";

    // stack ops
    case OP_TOALTSTACK             : return "OP_TOALTSTACK";
    case OP_FROMALTSTACK           : return "OP_FROMALTSTACK";
    case OP_2DROP                  : return "OP_2DROP";
    case OP_2DUP                   : return "OP_2DUP";
    case OP_3DUP                   : return "OP_3DUP";
    case OP_2OVER                  : return "OP_2OVER";
    case OP_2ROT                   : return "OP_2ROT";
    case OP_2SWAP                  : return "OP_2SWAP";
    case OP_IFDUP                  : return "OP_IFDUP";
    case OP_DEPTH                  : return "OP_DEPTH";
    case OP_DROP                   : return "OP_DROP";
    case OP_DUP                    : return "OP_DUP";
    case OP_NIP                    : return "OP_NIP";
    case OP_OVER                   : return "OP_OVER";
    case OP_PICK                   : return "OP_PICK";
    case OP_ROLL                   : return "OP_ROLL";
    case OP_ROT                    : return "OP_ROT";
    case OP_SWAP                   : return "OP_SWAP";
    case OP_TUCK                   : return "OP_TUCK";

    // splice ops
    case OP_CAT                    : return "OP_CAT";
    case OP_SUBSTR                 : return "OP_SUBSTR";
    case OP_LEFT                   : return "OP_LEFT";
    case OP_RIGHT                  : return "OP_RIGHT";
    case OP_SIZE                   : return "OP_SIZE";

    // bit logic
    case OP_INVERT                 : return "OP_INVERT";
    case OP_AND                    : return "OP_AND";
    case OP_OR                     : return "OP_OR";
    case OP_XOR                    : return "OP_XOR";
    case OP_EQUAL                  : return "OP_EQUAL";
    case OP_EQUALVERIFY            : return "OP_EQUALVERIFY";
    case OP_RESERVED1              : return "OP_RESERVED1";
    case OP_RESERVED2              : return "OP_RESERVED2";

    // numeric
    case OP_1ADD                   : return "OP_1ADD";
    case OP_1SUB                   : return "OP_1SUB";
    case OP_2MUL                   : return "OP_2MUL";
    case OP_2DIV                   : return "OP_2DIV";
    case OP_NEGATE                 : return "OP_NEGATE";
    case OP_ABS                    : return "OP_ABS";
    case OP_NOT                    : return "OP_NOT";
    case OP_0NOTEQUAL              : return "OP_0NOTEQUAL";
    case OP_ADD                    : return "OP_ADD";
    case OP_SUB                    : return "OP_SUB";
    case OP_MUL                    : return "OP_MUL";
    case OP_DIV                    : return "OP_DIV";
    case OP_MOD                    : return "OP_MOD";
    case OP_LSHIFT                 : return "OP_LSHIFT";
    case OP_RSHIFT                 : return "OP_RSHIFT";
    case OP_BOOLAND                : return "OP_BOOLAND";
    case OP_BOOLOR                 : return "OP_BOOLOR";
    case OP_NUMEQUAL               : return "OP_NUMEQUAL";
    case OP_NUMEQUALVERIFY         : return "OP_NUMEQUALVERIFY";
    case OP_NUMNOTEQUAL            : return "OP_NUMNOTEQUAL";
    case OP_LESSTHAN               : return "OP_LESSTHAN";
    case OP_GREATERTHAN            : return "OP_GREATERTHAN";
    case OP_LESSTHANOREQUAL        : return "OP_LESSTHANOREQUAL";
    case OP_GREATERTHANOREQUAL     : return "OP_GREATERTHANOREQUAL";
    case OP_MIN                    : return "OP_MIN";
    case OP_MAX                    : return "OP_MAX";
    case OP_WITHIN                 : return "OP_WITHIN";

    // crypto
    case OP_RIPEMD160              : return "OP_RIPEMD160";
    case OP_SHA1                   : return "OP_SHA1";
    case OP_SHA256                 : return "OP_SHA256";
    case OP_HASH160                : return "OP_HASH160";
    case OP_HASH256                : return "OP_HASH256";
    case OP_CODESEPARATOR          : return "OP_CODESEPARATOR";
    case OP_CHECKSIG               : return "OP_CHECKSIG";
    case OP_CHECKSIGVERIFY         : return "OP_CHECKSIGVERIFY";
    case OP_CHECKMULTISIG          : return "OP_CHECKMULTISIG";
    case OP_CHECKMULTISIGVERIFY    : return "OP_CHECKMULTISIGVERIFY";

    // expansion
    case OP_NOP1                   : return "OP_NOP1";
    case OP_CHECKLOCKTIMEVERIFY    : return "OP_CHECKLOCKTIMEVERIFY";
    case OP_CHECKSEQUENCEVERIFY    : return "OP_CHECKSEQUENCEVERIFY";
    case OP_NOP4                   : return "OP_NOP4";
    case OP_NOP5                   : return "OP_NOP5";
    case OP_NOP6                   : return "OP_NOP6";
    case OP_NOP7                   : return "OP_NOP7";
    case OP_NOP8                   : return "OP_NOP8";
    case OP_NOP9                   : return "OP_NOP9";
    case OP_NOP10                  : return "OP_NOP10";

    // Opcode added by BIP 342 (Tapscript)
    case OP_CHECKSIGADD            : return "OP_CHECKSIGADD";

    case OP_INVALIDOPCODE          : return "OP_INVALIDOPCODE";

    default:
        return "OP_UNKNOWN";
    }
}